

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::ParseableFunctionInfo::ParseableFunctionInfo
          (ParseableFunctionInfo *this,JavascriptMethod entryPoint,int nestedCount,
          LocalFunctionId functionId,Utf8SourceInfo *sourceInfo,ScriptContext *scriptContext,
          uint functionNumber,char16 *displayName,uint displayNameLength,uint displayShortNameOffset
          ,Attributes attributes,FunctionBodyFlags flags)

{
  Type *addr;
  Type *addr_00;
  Type *addr_01;
  Type *addr_02;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Recycler *pRVar4;
  FunctionInfo *this_00;
  undefined4 *puVar5;
  NestedArray *pNVar6;
  FunctionEntryPointInfo *this_01;
  undefined1 local_78 [8];
  TrackAllocData data;
  
  (this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_014ef888;
  (this->super_FunctionProxy).auxPtrs.ptr =
       (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)0x0;
  (this->super_FunctionProxy).functionInfo.ptr = (FunctionInfo *)0x0;
  (this->super_FunctionProxy).m_scriptContext = scriptContext;
  addr = &(this->super_FunctionProxy).m_utf8SourceInfo;
  Memory::Recycler::WBSetBit((char *)addr);
  (this->super_FunctionProxy).m_utf8SourceInfo.ptr = sourceInfo;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  (this->super_FunctionProxy).m_defaultEntryPointInfo.ptr = (ProxyEntryPointInfo *)0x0;
  (this->super_FunctionProxy).deferredPrototypeType.ptr = (ScriptFunctionType *)0x0;
  (this->super_FunctionProxy).undeferredFunctionType.ptr = (ScriptFunctionType *)0x0;
  (this->super_FunctionProxy).m_functionNumber = functionNumber;
  (this->super_FunctionProxy).field_0x44 = ((this->super_FunctionProxy).field_0x44 & 0xd0) + 1;
  (this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_014efa38;
  *(ushort *)&(this->super_FunctionProxy).field_0x45 =
       *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0x888 | 0x6041;
  (this->super_FunctionProxy).field_0x47 = 4;
  this->flags = flags;
  this->m_grfscr = 0;
  this->m_inParamCount = 0;
  this->m_reportedInParamCount = 0;
  this->m_cchStartOffset = 0;
  this->m_cchLength = 0;
  this->m_cbLength = 0;
  this->m_displayShortNameOffset = 0;
  this->scopeSlotArraySize = 0;
  this->paramScopeSlotArraySize = 0;
  this->m_sourceIndex = 0xffffffff;
  (this->m_displayName).ptr = (char16_t *)0x0;
  this->m_displayNameLength = 0;
  addr_02 = &this->nestedArray;
  (this->nestedArray).ptr = (NestedArray *)0x0;
  this->scopeObjectSize = 0;
  this->m_dynamicInterpreterThunk = (Type)0x0;
  (this->crossSiteDeferredFunctionType).ptr = (ScriptFunctionType *)0x0;
  (this->crossSiteUndeferredFunctionType).ptr = (ScriptFunctionType *)0x0;
  this->m_cbStartOffset = 0;
  this->m_lineNumber = 0;
  this->m_columnNumber = 0;
  local_78 = (undefined1  [8])&FunctionInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2ab601b;
  data.filename._0_4_ = 0x690;
  pRVar4 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_78);
  this_00 = (FunctionInfo *)new<Memory::Recycler>(0x20,pRVar4,0x38bbb2);
  data._32_8_ = entryPoint;
  FunctionInfo::FunctionInfo(this_00,entryPoint,attributes,functionId,&this->super_FunctionProxy);
  addr_00 = &(this->super_FunctionProxy).functionInfo;
  Memory::Recycler::WBSetBit((char *)addr_00);
  (this->super_FunctionProxy).functionInfo.ptr = this_00;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
  if (nestedCount < 1) {
    addr_02->ptr = (NestedArray *)0x0;
  }
  else {
    local_78 = (undefined1  [8])&NestedArray::typeinfo;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2ab601b;
    data.filename._0_4_ = 0x695;
    data.typeinfo = (type_info *)((ulong)(uint)nestedCount * 8);
    pRVar4 = Memory::Recycler::TrackAllocInfo
                       (((this->super_FunctionProxy).m_scriptContext)->recycler,
                        (TrackAllocData *)local_78);
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00765dc7;
      *puVar5 = 0;
    }
    pNVar6 = (NestedArray *)
             Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                       (pRVar4,(size_t)((type_info *)((ulong)(uint)nestedCount * 8) + 8));
    if (pNVar6 == (NestedArray *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x20d,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) goto LAB_00765dc7;
      *puVar5 = 0;
    }
    pNVar6->nestedCount = nestedCount;
    Memory::Recycler::WBSetBit((char *)addr_02);
    addr_02->ptr = pNVar6;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_02);
  }
  if ((attributes & DeferredParse) == None) {
    local_78 = (undefined1  [8])&FunctionEntryPointInfo::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2ab601b;
    data.filename._0_4_ = 0x69f;
    pRVar4 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_78);
    this_01 = (FunctionEntryPointInfo *)new<Memory::Recycler>(0x88,pRVar4,0x3a2aea);
    FunctionEntryPointInfo::FunctionEntryPointInfo
              (this_01,&this->super_FunctionProxy,(JavascriptMethod)data._32_8_,
               scriptContext->threadContext);
  }
  else {
    local_78 = (undefined1  [8])&ProxyEntryPointInfo::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2ab601b;
    data.filename._0_4_ = 0x6a3;
    pRVar4 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_78);
    this_01 = (FunctionEntryPointInfo *)new<Memory::Recycler>(0x18,pRVar4,0x38bbb2);
    ExpirableObject::ExpirableObject((ExpirableObject *)this_01,(ThreadContext *)0x0);
    (this_01->super_EntryPointInfo).super_ProxyEntryPointInfo.super_ExpirableObject.
    super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
         (_func_int **)&PTR_Finalize_014eff80;
    (this_01->super_EntryPointInfo).super_ProxyEntryPointInfo.jsMethod = (Type)data._32_8_;
  }
  addr_01 = &(this->super_FunctionProxy).m_defaultEntryPointInfo;
  Memory::Recycler::WBSetBit((char *)addr_01);
  (this->super_FunctionProxy).m_defaultEntryPointInfo.ptr = (ProxyEntryPointInfo *)this_01;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_01);
  (*(this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[6])
            (this,displayName,(ulong)displayNameLength,(ulong)displayShortNameOffset,0);
  if ((this->super_FunctionProxy).functionInfo.ptr == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4e3,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) goto LAB_00765dc7;
    *puVar5 = 0;
  }
  if ((ParseableFunctionInfo *)
      (((this->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4e4,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar2) {
LAB_00765dc7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  FunctionInfo::SetOriginalEntryPoint
            (addr_00->ptr,InterpreterStackFrame::DelayDynamicInterpreterThunk);
  return;
}

Assistant:

ParseableFunctionInfo::ParseableFunctionInfo(JavascriptMethod entryPoint, int nestedCount,
        LocalFunctionId functionId, Utf8SourceInfo* sourceInfo, ScriptContext* scriptContext, uint functionNumber,
        const char16* displayName, uint displayNameLength, uint displayShortNameOffset, FunctionInfo::Attributes attributes, FunctionBodyFlags flags) :
      FunctionProxy(scriptContext, sourceInfo, functionNumber),
      crossSiteDeferredFunctionType(nullptr),
      crossSiteUndeferredFunctionType(nullptr),
#if DYNAMIC_INTERPRETER_THUNK
      m_dynamicInterpreterThunk(nullptr),
#endif
      flags(flags),
      m_hasBeenParsed(false),
      m_isGlobalFunc(false),
      m_isDeclaration(false),
      m_isNamedFunctionExpression(false),
      m_isNameIdentifierRef (true),
      m_isStaticNameFunction(false),
      m_doBackendArgumentsOptimization(true),
      m_doScopeObjectCreation(true),
      m_usesArgumentsObject(false),
      m_isStrictMode(false),
      m_isAsmjsMode(false),
      m_dontInline(false),
      m_hasImplicitArgIns(true),
      m_grfscr(0),
      m_inParamCount(0),
      m_reportedInParamCount(0),
      m_sourceIndex(Js::Constants::InvalidSourceIndex),
      m_utf8SourceHasBeenSet(false),
      m_cchLength(0),
      m_cbLength(0),
      m_cchStartOffset(0),
      m_cbStartOffset(0),
      m_lineNumber(0),
      m_columnNumber(0),
      m_isEval(false),
      m_isDynamicFunction(false),
      m_displayName(nullptr),
      m_displayNameLength(0),
      m_displayShortNameOffset(0),
      scopeSlotArraySize(0),
      paramScopeSlotArraySize(0),
      m_reparsed(false),
      m_isAsmJsFunction(false),
      m_tag21(true),
      m_isMethod(false)
#if DBG
      ,m_wasEverAsmjsMode(false)
      ,scopeObjectSize(0)
#endif
    {
        this->functionInfo = RecyclerNew(scriptContext->GetRecycler(), FunctionInfo, entryPoint, attributes, functionId, this);

        if (nestedCount > 0)
        {
            nestedArray = RecyclerNewPlusZ(m_scriptContext->GetRecycler(),
                nestedCount*sizeof(FunctionProxy*), NestedArray, nestedCount);
        }
        else
        {
            nestedArray = nullptr;
        }

        if ((attributes & Js::FunctionInfo::DeferredParse) == 0)
        {
            this->m_defaultEntryPointInfo = RecyclerNewFinalized(scriptContext->GetRecycler(),
                FunctionEntryPointInfo, this, entryPoint, scriptContext->GetThreadContext());
        }
        else
        {
            this->m_defaultEntryPointInfo = RecyclerNew(scriptContext->GetRecycler(), ProxyEntryPointInfo, entryPoint);
        }

        SetDisplayName(displayName, displayNameLength, displayShortNameOffset);
        this->SetOriginalEntryPoint(DefaultEntryThunk);
    }